

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O3

void addGoToRecord(xformDatabase *xdb,char *rec)

{
  goToRec *pgVar1;
  char *pcVar2;
  ulong uVar3;
  bool bVar4;
  double dVar5;
  
  if (rec != (char *)0x0 && xdb != (xformDatabase *)0x0) {
    pgVar1 = (goToRec *)calloc(1,0x48);
    if (pgVar1 == (goToRec *)0x0) {
      warn("could not create \'go to\' record");
      return;
    }
    if (xdb->golist == (goToRec *)0x0) {
      xdb->golist = pgVar1;
    }
    if (xdb->glast != (goToRec *)0x0) {
      xdb->glast->next = pgVar1;
    }
    xdb->glast = pgVar1;
    pcVar2 = strtok(rec,":");
    if ((pcVar2 != (char *)0x0) && (pcVar2 = strtok((char *)0x0,":"), pcVar2 != (char *)0x0)) {
      uVar3 = 0;
      do {
        dVar5 = atof(pcVar2);
        pgVar1->level[uVar3] = dVar5;
        pcVar2 = strtok((char *)0x0,":");
        if (pcVar2 == (char *)0x0) {
          return;
        }
        bVar4 = uVar3 < 7;
        uVar3 = uVar3 + 1;
      } while (bVar4);
    }
  }
  return;
}

Assistant:

void addGoToRecord(xformDatabase* xdb, char *rec) {
   char *p = NULL;
   int i = 0;
   goToRec* g = NULL;

   if (xdb && rec) {
      g = (goToRec *)malloc(sizeof(goToRec));
      if (!g) {
         warn("could not create 'go to' record");
         return;
      }

      /* initialize */
      g->next = NULL;
      for(i = 0; i < MAX_XFORM_LEVELS; i++) {
         g->level[i] = 0.0;
      }

      if (! xdb->golist) { xdb->golist = g; }
      if (xdb->glast) { xdb->glast->next = g; }
      xdb->glast = g;

      p = strtok(rec, XFORMREC_DELIM); /* type id */
      if (p) {
	 p = strtok(NULL, XFORMREC_DELIM);
	 for(i=0; p && (i < MAX_XFORM_LEVELS); i++) {
	    g->level[i] = atof(p);
	    p = strtok(NULL, XFORMREC_DELIM);
	 }
      }
   }
}